

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

int __thiscall
FFlatVertexBuffer::CreateSectorVertices
          (FFlatVertexBuffer *this,sector_t *sec,secplane_t *plane,int floor)

{
  uint uVar1;
  subsector_t *sub;
  int j;
  int rt;
  int floor_local;
  secplane_t *plane_local;
  sector_t *sec_local;
  FFlatVertexBuffer *this_local;
  
  uVar1 = TArray<FFlatVertex,_FFlatVertex>::Size(&this->vbo_shadowdata);
  for (sub._4_4_ = 0; sub._4_4_ < sec->subsectorcount; sub._4_4_ = sub._4_4_ + 1) {
    CreateSubsectorVertices(this,sec->subsectors[sub._4_4_],plane,floor);
  }
  return uVar1;
}

Assistant:

int FFlatVertexBuffer::CreateSectorVertices(sector_t *sec, const secplane_t &plane, int floor)
{
	int rt = vbo_shadowdata.Size();
	// First calculate the vertices for the sector itself
	for(int j=0; j<sec->subsectorcount; j++)
	{
		subsector_t *sub = sec->subsectors[j];
		CreateSubsectorVertices(sub, plane, floor);
	}
	return rt;
}